

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MatrixBandPartLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_matrixbandpart(NeuralNetworkLayer *this)

{
  bool bVar1;
  MatrixBandPartLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_matrixbandpart(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_matrixbandpart(this);
    this_00 = (MatrixBandPartLayerParams *)operator_new(0x28);
    MatrixBandPartLayerParams::MatrixBandPartLayerParams(this_00);
    (this->layer_).matrixbandpart_ = this_00;
  }
  return (MatrixBandPartLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MatrixBandPartLayerParams* NeuralNetworkLayer::mutable_matrixbandpart() {
  if (!has_matrixbandpart()) {
    clear_layer();
    set_has_matrixbandpart();
    layer_.matrixbandpart_ = new ::CoreML::Specification::MatrixBandPartLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.matrixBandPart)
  return layer_.matrixbandpart_;
}